

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_column_data.cpp
# Opt level: O1

ScanVectorType __thiscall
duckdb::StandardColumnData::GetVectorScanType
          (StandardColumnData *this,ColumnScanState *state,idx_t scan_count,Vector *result)

{
  bool bVar1;
  reference pvVar2;
  ScanVectorType SVar3;
  
  if (result->vector_type == FLAT_VECTOR) {
    bVar1 = ColumnData::HasUpdates(&this->super_ColumnData);
    if (bVar1) {
      return SCAN_FLAT_VECTOR;
    }
    if (((state->current->super_SegmentBase<duckdb::ColumnSegment>).count.
         super___atomic_base<unsigned_long>._M_i +
        (state->current->super_SegmentBase<duckdb::ColumnSegment>).start) - state->row_index <
        scan_count) {
      return SCAN_FLAT_VECTOR;
    }
  }
  if ((state->child_states).
      super_vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>.
      super__Vector_base<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (state->child_states).
      super_vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>.
      super__Vector_base<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    SVar3 = SCAN_ENTIRE_VECTOR;
  }
  else {
    SVar3 = SCAN_ENTIRE_VECTOR;
    pvVar2 = vector<duckdb::ColumnScanState,_true>::operator[](&state->child_states,0);
    if (result->vector_type == FLAT_VECTOR) {
      bVar1 = ColumnData::HasUpdates(&(this->validity).super_ColumnData);
      SVar3 = SCAN_FLAT_VECTOR;
      if (!bVar1) {
        SVar3 = (ScanVectorType)
                (((pvVar2->current->super_SegmentBase<duckdb::ColumnSegment>).count.
                  super___atomic_base<unsigned_long>._M_i +
                 (pvVar2->current->super_SegmentBase<duckdb::ColumnSegment>).start) -
                 pvVar2->row_index < scan_count);
      }
    }
  }
  return SVar3;
}

Assistant:

ScanVectorType StandardColumnData::GetVectorScanType(ColumnScanState &state, idx_t scan_count, Vector &result) {
	// if either the current column data, or the validity column data requires flat vectors, we scan flat vectors
	auto scan_type = ColumnData::GetVectorScanType(state, scan_count, result);
	if (scan_type == ScanVectorType::SCAN_FLAT_VECTOR) {
		return ScanVectorType::SCAN_FLAT_VECTOR;
	}
	if (state.child_states.empty()) {
		return scan_type;
	}
	return validity.GetVectorScanType(state.child_states[0], scan_count, result);
}